

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::DGXMLScanner::scanAttValue
          (DGXMLScanner *this,XMLAttDef *attDef,XMLCh *attrName,XMLBuffer *toFill)

{
  ReaderMgr *this_00;
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  XMLByte *pXVar7;
  bool escaped;
  XMLCh nextCh;
  bool local_83;
  XMLCh secondCh;
  UnexpectedEOFException *local_80;
  ulong local_78;
  XMLCh quoteCh;
  ulong local_68;
  XMLCh *local_60;
  XMLBuffer *local_58;
  ulong local_50;
  XMLCh tmpBuf [9];
  
  if (attDef == (XMLAttDef *)0x0) {
    local_50 = 0;
  }
  else {
    local_50 = (ulong)(uint)attDef->fType;
  }
  toFill->fIndex = 0;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  local_60 = attrName;
  bVar3 = ReaderMgr::skipIfQuote(this_00,&quoteCh);
  if (!bVar3) {
    return false;
  }
  local_83 = true;
  if ((attDef != (XMLAttDef *)0x0) && (attDef->fExternalAttribute == true)) {
    local_83 = (int)local_50 - 8U < 0xfffffff9;
  }
  uVar1 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum;
  secondCh = L'\0';
  local_68 = 0;
  uVar6 = 1;
  bVar3 = false;
  local_58 = toFill;
  do {
    local_80 = (UnexpectedEOFException *)CONCAT44(local_80._4_4_,(int)uVar6);
    local_78 = uVar6;
    bVar2 = bVar3;
LAB_002a0063:
    do {
      bVar5 = bVar2;
      nextCh = ReaderMgr::getNextChar(this_00);
      if (nextCh == L'\0') {
        local_80 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
        UnexpectedEOFException::UnexpectedEOFException
                  (local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                   ,0xb04,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
        __cxa_throw(local_80,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
      }
      if (nextCh == quoteCh) {
        uVar6 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum;
        bVar3 = uVar1 == uVar6;
        if (bVar3) {
          return bVar3;
        }
        if (uVar6 <= uVar1 && !bVar3) {
          XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
          return bVar3;
        }
      }
      if (nextCh == L'&') {
        iVar4 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler
                  [0xd])(this,1,&nextCh);
        bVar2 = false;
        bVar3 = bVar5;
        if (iVar4 != 1) goto LAB_002a0063;
      }
      else {
        if ((nextCh & 0xfc00U) == 0xdc00) {
          if (!bVar5) {
            XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
          }
        }
        else {
          if ((nextCh & 0xfc00U) == 0xd800) {
            bVar3 = true;
            if (bVar5) {
              XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
              bVar3 = bVar5;
            }
            goto LAB_002a0187;
          }
          if (bVar5) {
            XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
          }
          if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)nextCh] &
              0x40) == 0) {
            XMLString::binToText
                      ((uint)(ushort)nextCh,tmpBuf,8,0x10,(this->super_XMLScanner).fMemoryManager);
            XMLScanner::emitError
                      (&this->super_XMLScanner,InvalidCharacterInAttrValue,local_60,tmpBuf,
                       (XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        bVar3 = false;
      }
LAB_002a0187:
      if (nextCh == L'<') {
        XMLScanner::emitError
                  (&this->super_XMLScanner,BracketInAttrValue,local_60,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      if ((int)local_50 == 0) {
        if (((ushort)nextCh < 0xe) && ((0x2600U >> ((ushort)nextCh & 0x1f) & 1) != 0)) {
          if (((this->super_XMLScanner).fStandalone == true) &&
             ((this->super_XMLScanner).fValidate == true && local_83 == false)) {
            XMLValidator::emitError
                      ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,local_60,
                       (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          nextCh = L' ';
        }
        goto LAB_002a0344;
      }
      bVar2 = bVar3;
      if ((int)local_78 != 0) {
        if (((ulong)(ushort)nextCh != 0x20) &&
           (pXVar7 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable,
           -1 < (char)pXVar7[(ushort)nextCh])) goto LAB_002a02cd;
        local_78 = 0;
        if (((this->super_XMLScanner).fStandalone == true) &&
           ((this->super_XMLScanner).fValidate == true && local_83 == false)) {
          if ((local_68 & 1) != 0) {
            if (nextCh == L' ') goto LAB_002a0063;
            local_78 = 0;
            bVar3 = ReaderMgr::lookingAtSpace(this_00);
            local_78 = 0;
            if (!bVar3) goto LAB_002a0063;
          }
          local_78 = 0;
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,local_60,
                     (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        goto LAB_002a0063;
      }
      pXVar7 = (XMLByte *)(ulong)(ushort)nextCh;
      local_78 = 0;
    } while ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(long)pXVar7]
             < '\0');
    local_78 = 0;
    if ((local_68 & 1) != 0) {
      local_80 = (UnexpectedEOFException *)((ulong)local_80 & 0xffffffff00000000);
      XMLBuffer::append(local_58,L' ');
    }
LAB_002a02cd:
    local_80 = (UnexpectedEOFException *)CONCAT44(local_80._4_4_,1);
    local_68 = CONCAT71((int7)((ulong)pXVar7 >> 8),1);
LAB_002a0344:
    XMLBuffer::append(local_58,nextCh);
    uVar6 = (ulong)local_80 & 0xffffffff;
    if (secondCh != L'\0') {
      XMLBuffer::append(local_58,secondCh);
      secondCh = L'\0';
      uVar6 = (ulong)local_80 & 0xffffffff;
    }
  } while( true );
}

Assistant:

bool DGXMLScanner::scanAttValue(  const   XMLAttDef* const    attDef
                                  , const XMLCh *const attrName
                                  ,       XMLBuffer&          toFill)
{
    enum States
    {
        InWhitespace
        , InContent
    };

    // Get the type and name
    const XMLAttDef::AttTypes type = (attDef)
                        ?attDef->getType()
                        :XMLAttDef::CData;

    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr.skipIfQuote(quoteCh))
        return false;

    //  We have to get the current reader because we have to ignore closing
    //  quotes until we hit the same reader again.
    const XMLSize_t curReader = fReaderMgr.getCurrentReaderNum();

    // check to see if it's a tokenized type that is declared externally 
    bool  isAttTokenizedExternal = (attDef)
                                   ?attDef->isExternal() && (type == XMLAttDef::ID || 
                                                             type == XMLAttDef::IDRef || 
                                                             type == XMLAttDef::IDRefs || 
                                                             type == XMLAttDef::Entity || 
                                                             type == XMLAttDef::Entities || 
                                                             type == XMLAttDef::NmToken || 
                                                             type == XMLAttDef::NmTokens)
                                   :false;

    //  Loop until we get the attribute value. Note that we use a double
    //  loop here to avoid the setup/teardown overhead of the exception
    //  handler on every round.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = InContent;
    bool    firstNonWS = false;
    bool    gotLeadingSurrogate = false;
    bool    escaped;
    while (true)
    {
    try
    {
        while(true)
        {
            nextCh = fReaderMgr.getNextChar();

            if (!nextCh)
                ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

            // Check for our ending quote in the same entity
            if (nextCh == quoteCh)
            {
                if (curReader == fReaderMgr.getCurrentReaderNum())
                    return true;

                // Watch for spillover into a previous entity
                if (curReader > fReaderMgr.getCurrentReaderNum())
                {
                    emitError(XMLErrs::PartialMarkupInEntity);
                    return false;
                }
            }

            //  Check for an entity ref now, before we let it affect our
            //  whitespace normalization logic below. We ignore the empty flag
            //  in this one.
            escaped = false;
            if (nextCh == chAmpersand)
            {
                if (scanEntityRef(true, nextCh, secondCh, escaped) != EntityExp_Returned)
                {
                    gotLeadingSurrogate = false;
                    continue;
                }
            }
            else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                // Deal with surrogate pairs
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    // Its got to at least be a valid XML character
                    if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacterInAttrValue, attrName, tmpBuf);
                    }
                }
                gotLeadingSurrogate = false;
            }

            //  If its not escaped, then make sure its not a < character, which
            //  is not allowed in attribute values.
            if (!escaped && (nextCh == chOpenAngle))
                emitError(XMLErrs::BracketInAttrValue, attrName);

            //  If the attribute is a CDATA type we do simple replacement of
            //  tabs and new lines with spaces, if the character is not escaped
            //  by way of a char ref.
            //
            //  Otherwise, we do the standard non-CDATA normalization of
            //  compressing whitespace to single spaces and getting rid of leading
            //  and trailing whitespace.
            if (type == XMLAttDef::CData)
            {
                if (!escaped)
                {
                    if ((nextCh == 0x09) || (nextCh == 0x0A) || (nextCh == 0x0D))
                    {
                        // Check Validity Constraint for Standalone document declaration
                        // XML 1.0, Section 2.9
                        if (fStandalone && fValidate && isAttTokenizedExternal)
                        {
                             // Can't have a standalone document declaration of "yes" if  attribute
                             // values are subject to normalisation
                             fValidator->emitError(XMLValid::NoAttNormForStandalone, attrName);
                        }
                        nextCh = chSpace;
                    }
                }
            }
            else
            {
                if (curState == InWhitespace)
                {
                    if ((escaped && nextCh != chSpace) || !fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                    {
                        if (firstNonWS)
                            toFill.append(chSpace);
                        curState = InContent;
                        firstNonWS = true;
                    }
                    else
                    {
                        continue;
                    }
                }
                else if (curState == InContent)
                {
                    if ((nextCh == chSpace) ||
                        (fReaderMgr.getCurrentReader()->isWhitespace(nextCh) && !escaped))
                    {
                        curState = InWhitespace;

                        // Check Validity Constraint for Standalone document declaration
                        // XML 1.0, Section 2.9
                        if (fStandalone && fValidate && isAttTokenizedExternal)
                        {
                            if (!firstNonWS || (nextCh != chSpace && fReaderMgr.lookingAtSpace()))
                            {
                                 // Can't have a standalone document declaration of "yes" if  attribute
                                 // values are subject to normalisation
                                 fValidator->emitError(XMLValid::NoAttNormForStandalone, attrName);
                            }
                        }
                        continue;
                    }
                    firstNonWS = true;
                }
            }

            // Else add it to the buffer
            toFill.append(nextCh);

            if (secondCh)
            {
                toFill.append(secondCh);
                secondCh=0;
            }
        }
    }
    catch(const EndOfEntityException&)
    {
        // Just eat it and continue.
        gotLeadingSurrogate = false;
        escaped = false;
    }
    }
    return true;
}